

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestSubmitHandler::SubmitUsingHTTP
          (cmCTestSubmitHandler *this,string *localprefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *remoteprefix,string *url)

{
  undefined1 *puVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  reference pbVar5;
  CURL_conflict *data;
  int *piVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  uint *puVar8;
  bool *pbVar9;
  char *pcVar10;
  undefined8 uVar11;
  ulong uVar12;
  ostream *poVar13;
  long lVar14;
  cmCTestScriptHandler *this_00;
  cmState *this_01;
  unsigned_long uVar15;
  void *pvVar16;
  size_type sVar17;
  string *psVar18;
  rep_conflict rVar19;
  int local_255c;
  string local_22e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22c0;
  undefined1 local_22a0 [8];
  ostringstream cmCTestLog_msg_14;
  string local_2128 [32];
  cmCTestLogWrite local_2108;
  undefined1 local_20f8 [8];
  ostringstream cmCTestLog_msg_13;
  cmCTestLogWrite local_1f80;
  string local_1f70 [32];
  undefined1 local_1f50 [8];
  ostringstream cmCTestLog_msg_12;
  string local_1dd8 [32];
  undefined1 local_1db8 [8];
  ostringstream cmCTestLog_msg_11;
  vector<char,_std::allocator<char>_> local_1c40;
  string local_1c28 [32];
  cmCTestLogWrite local_1c08;
  undefined1 local_1bf8 [8];
  ostringstream cmCTestLog_msg_10;
  string local_1a80 [32];
  undefined1 local_1a60 [8];
  ostringstream cmCTestLog_msg_9;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18e8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18e0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  local_18d8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  stop;
  undefined1 local_18b0 [8];
  ostringstream cmCTestLog_msg_8;
  int local_1738;
  allocator<char> local_1731;
  int i;
  string local_1710;
  int local_16f0;
  byte local_16ec;
  byte local_16eb;
  byte local_16ea;
  allocator<char> local_16e9;
  int count;
  string local_16c8;
  int local_16a4;
  duration<double,_std::ratio<1L,_1L>_> local_16a0;
  cmDuration delay;
  string local_1690;
  cmValue local_1670;
  string local_1668 [8];
  string retryCount;
  string local_1640;
  cmValue local_1620;
  string local_1618 [8];
  string retryDelay;
  long lStack_15f0;
  bool successful_submission;
  long response_code;
  cmCTestLogWrite local_15c8;
  undefined1 local_15b8 [8];
  ostringstream cmCTestLog_msg_7;
  vector<char,_std::allocator<char>_> local_1440;
  string local_1428 [32];
  cmCTestLogWrite local_1408;
  undefined1 local_13f8 [8];
  ostringstream cmCTestLog_msg_6;
  undefined1 local_1280 [8];
  cmCTestSubmitHandlerVectorOfChar chunkDebug;
  cmCTestSubmitHandlerVectorOfChar chunk;
  undefined1 local_1230 [8];
  ostringstream cmCTestLog_msg_5;
  unsigned_long filelen;
  string local_10a8 [32];
  undefined1 local_1088 [8];
  ostringstream cmCTestLog_msg_4;
  string local_f10;
  undefined1 local_ef0 [8];
  cmCryptoHash hasher;
  string local_ed8;
  cmValue local_eb8;
  string local_eb0;
  allocator<char> local_e89;
  string local_e88;
  cmValue local_e68;
  cmValue subproject;
  cmake *cm;
  cmCTestScriptHandler *ch;
  string local_e30;
  string local_e10;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  string local_da8;
  string local_d88;
  allocator<char> local_d61;
  string local_d60;
  string local_d40;
  string local_d20;
  undefined1 local_d00 [8];
  cmCTestCurl ctest_curl;
  undefined1 local_c70 [8];
  string upload_as;
  string ofile;
  undefined1 local_c10 [8];
  string remote_file;
  undefined1 local_bc8 [7];
  bool initialize_cdash_buildid;
  string local_file;
  string local_ba0 [4];
  int submitInactivityTimeout;
  ostringstream local_b80 [8];
  ostringstream cmCTestLog_msg_3;
  string local_a08 [32];
  ostringstream local_9e8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_870 [38];
  byte local_84a;
  allocator<char> local_849;
  string local_848 [32];
  undefined1 local_828 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_6b0 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tlsVersionStr;
  string local_668;
  reference local_648;
  string *file;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  cmCTestCurlOpts curlOpts;
  ostringstream local_5e8 [8];
  ostringstream cmCTestLog_msg;
  string *h;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  curl_slist *headers;
  char error_buffer [1024];
  FILE *ftpfile;
  CURL *curl;
  string *url_local;
  string *remoteprefix_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *localprefix_local;
  cmCTestSubmitHandler *this_local;
  
  __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->HttpHeaders);
  h = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->HttpHeaders);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&h), bVar3) {
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::ostringstream::ostringstream(local_5e8);
    poVar13 = std::operator<<((ostream *)local_5e8,"   Add HTTP Header: \"");
    poVar13 = std::operator<<(poVar13,(string *)pbVar5);
    poVar13 = std::operator<<(poVar13,"\"");
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar10 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0xa9,pcVar10,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string
              ((string *)
               &curlOpts.TLSVersionOpt.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>._M_engaged);
    std::__cxx11::ostringstream::~ostringstream(local_5e8);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)curl_slist_append((curl_slist *)__range1,pcVar10);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  curl_global_init(3);
  cmCTestCurlOpts::cmCTestCurlOpts
            ((cmCTestCurlOpts *)((long)&__range1_1 + 4),(this->super_cmCTestGenericHandler).CTest);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(files);
  file = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(files);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&file), bVar3) {
    local_648 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      pbVar9 = &tlsVersionStr.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged;
      std::__cxx11::string::string((string *)pbVar9);
      cmCurlSetCAInfo(&local_668,data,(string *)pbVar9);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string
                ((string *)
                 &tlsVersionStr.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged);
      bVar3 = std::optional::operator_cast_to_bool((optional *)((long)&__range1_1 + 4));
      if (bVar3) {
        piVar6 = std::optional<int>::operator*((optional<int> *)((long)&__range1_1 + 4));
        cmCurlPrintTLSVersion_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_6b0,*piVar6);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_828);
        poVar13 = std::operator<<((ostream *)local_828,"  Set CURLOPT_SSLVERSION to ");
        bVar3 = std::optional::operator_cast_to_bool((optional *)local_6b0);
        local_84a = 0;
        if (bVar3) {
          pbVar7 = std::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_6b0);
          std::__cxx11::string::string(local_848,(string *)pbVar7);
        }
        else {
          std::allocator<char>::allocator();
          local_84a = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_848,"unknown value",&local_849);
        }
        poVar13 = std::operator<<(poVar13,local_848);
        std::operator<<(poVar13,"\n");
        std::__cxx11::string::~string(local_848);
        if ((local_84a & 1) != 0) {
          std::allocator<char>::~allocator(&local_849);
        }
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xbc,pcVar10,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_870);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_828);
        puVar8 = (uint *)std::optional<int>::operator*((optional<int> *)((long)&__range1_1 + 4));
        curl_easy_setopt(data,CURLOPT_SSLVERSION,(ulong)*puVar8);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_6b0);
      }
      bVar3 = std::optional::operator_cast_to_bool((optional *)&curlOpts);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_9e8);
        poVar13 = std::operator<<((ostream *)local_9e8,"  Set CURLOPT_SSL_VERIFYPEER to ");
        pbVar9 = std::optional<bool>::operator*((optional<bool> *)&curlOpts);
        pcVar10 = "off";
        if ((*pbVar9 & 1U) != 0) {
          pcVar10 = "on";
        }
        poVar13 = std::operator<<(poVar13,pcVar10);
        std::operator<<(poVar13,"\n");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xc4,pcVar10,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_a08);
        std::__cxx11::ostringstream::~ostringstream(local_9e8);
        pbVar9 = std::optional<bool>::operator*((optional<bool> *)&curlOpts);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,(ulong)((*pbVar9 & 1U) != 0));
      }
      if ((curlOpts.TLSVersionOpt.super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>._M_payload._M_value._2_1_ & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_b80);
        std::operator<<((ostream *)local_b80,"  Set CURLOPT_SSL_VERIFYHOST to off\n");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xcb,pcVar10,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_ba0);
        std::__cxx11::ostringstream::~ostringstream(local_b80);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYHOST,0);
      }
      if (0 < this->HTTPProxyType) {
        uVar11 = std::__cxx11::string::c_str();
        curl_easy_setopt(data,CURLOPT_PROXY,uVar11);
        if (this->HTTPProxyType == 2) {
          curl_easy_setopt(data,CURLOPT_PROXYTYPE,4);
        }
        else if (this->HTTPProxyType == 3) {
          curl_easy_setopt(data,CURLOPT_PROXYTYPE,5);
        }
        else {
          curl_easy_setopt(data,CURLOPT_PROXYTYPE,0);
          uVar12 = std::__cxx11::string::empty();
          if ((uVar12 & 1) == 0) {
            uVar11 = std::__cxx11::string::c_str();
            curl_easy_setopt(data,CURLOPT_PROXYUSERPWD,uVar11);
          }
        }
      }
      bVar3 = cmCTest::ShouldUseHTTP10((this->super_cmCTestGenericHandler).CTest);
      if (bVar3) {
        curl_easy_setopt(data,CURLOPT_HTTP_VERSION,1);
      }
      curl_easy_setopt(data,CURLOPT_UPLOAD,1);
      curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
      local_file.field_2._12_4_ = GetSubmitInactivityTimeout(this);
      if (local_file.field_2._12_4_ != 0) {
        curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,(ulong)(uint)local_file.field_2._12_4_);
      }
      curl_easy_setopt(data,CURLOPT_VERBOSE,1);
      curl_easy_setopt(data,CURLOPT_HTTPHEADER,__range1);
      std::__cxx11::string::string((string *)local_bc8,(string *)local_648);
      bVar3 = cmsys::SystemTools::FileExists((string *)local_bc8);
      if (!bVar3) {
        cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
                  ((string *)((long)&remote_file.field_2 + 8),localprefix,(char (*) [2])0x11e13c1,
                   local_648);
        std::__cxx11::string::operator=
                  ((string *)local_bc8,(string *)(remote_file.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(remote_file.field_2._M_local_buf + 8));
      }
      cmsys::SystemTools::GetFilenameName((string *)((long)&ofile.field_2 + 8),local_648);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c10,
                     remoteprefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ofile.field_2 + 8));
      std::__cxx11::string::~string((string *)(ofile.field_2._M_local_buf + 8));
      poVar13 = std::operator<<(this->LogFile,"\tUpload file: ");
      poVar13 = std::operator<<(poVar13,(string *)local_bc8);
      poVar13 = std::operator<<(poVar13," to ");
      poVar13 = std::operator<<(poVar13,(string *)local_c10);
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
      cmSystemTools::EncodeURL((string *)((long)&upload_as.field_2 + 8),(string *)local_c10,true);
      lVar14 = std::__cxx11::string::find((char)url,0x3f);
      ctest_curl._135_1_ = 0x26;
      if (lVar14 == -1) {
        ctest_curl._135_1_ = 0x3f;
      }
      cmStrCat<std::__cxx11::string_const&,char,char_const(&)[10],std::__cxx11::string&>
                ((string *)local_c70,url,&ctest_curl.field_0x87,(char (*) [10])"FileName=",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&upload_as.field_2 + 8));
      if (!bVar3) {
        cmCTestCurl::cmCTestCurl((cmCTestCurl *)local_d00,(this->super_cmCTestGenericHandler).CTest)
        ;
        std::__cxx11::string::operator+=((string *)local_c70,"&build=");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d60,"BuildName",&local_d61);
        cmCTest::GetCTestConfiguration(&local_d40,pcVar2,&local_d60);
        cmCTestCurl::Escape(&local_d20,(cmCTestCurl *)local_d00,&local_d40);
        std::__cxx11::string::operator+=((string *)local_c70,(string *)&local_d20);
        std::__cxx11::string::~string((string *)&local_d20);
        std::__cxx11::string::~string((string *)&local_d40);
        std::__cxx11::string::~string((string *)&local_d60);
        std::allocator<char>::~allocator(&local_d61);
        std::__cxx11::string::operator+=((string *)local_c70,"&site=");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_dc8,"Site",&local_dc9);
        cmCTest::GetCTestConfiguration(&local_da8,pcVar2,&local_dc8);
        cmCTestCurl::Escape(&local_d88,(cmCTestCurl *)local_d00,&local_da8);
        std::__cxx11::string::operator+=((string *)local_c70,(string *)&local_d88);
        std::__cxx11::string::~string((string *)&local_d88);
        std::__cxx11::string::~string((string *)&local_da8);
        std::__cxx11::string::~string((string *)&local_dc8);
        std::allocator<char>::~allocator(&local_dc9);
        std::__cxx11::string::operator+=((string *)local_c70,"&stamp=");
        cmCTest::GetCurrentTag_abi_cxx11_(&local_e10,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&local_df0,(cmCTestCurl *)local_d00,&local_e10);
        std::__cxx11::string::operator+=((string *)local_c70,(string *)&local_df0);
        std::__cxx11::string::~string((string *)&local_df0);
        std::__cxx11::string::~string((string *)&local_e10);
        std::__cxx11::string::operator+=((string *)local_c70,"-");
        cmCTest::GetTestModelString_abi_cxx11_
                  ((string *)&ch,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&local_e30,(cmCTestCurl *)local_d00,(string *)&ch);
        std::__cxx11::string::operator+=((string *)local_c70,(string *)&local_e30);
        std::__cxx11::string::~string((string *)&local_e30);
        std::__cxx11::string::~string((string *)&ch);
        this_00 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
        subproject.Value = (string *)cmCTestScriptHandler::GetCMake(this_00);
        if ((cmake *)subproject.Value != (cmake *)0x0) {
          this_01 = cmake::GetState((cmake *)subproject.Value);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e88,"SubProject",&local_e89);
          local_e68 = cmState::GetGlobalProperty(this_01,&local_e88);
          std::__cxx11::string::~string((string *)&local_e88);
          std::allocator<char>::~allocator(&local_e89);
          bVar3 = cmValue::operator_cast_to_bool(&local_e68);
          if (bVar3) {
            std::__cxx11::string::operator+=((string *)local_c70,"&subproject=");
            psVar18 = cmValue::operator*[abi_cxx11_(&local_e68);
            cmCTestCurl::Escape(&local_eb0,(cmCTestCurl *)local_d00,psVar18);
            std::__cxx11::string::operator+=((string *)local_c70,(string *)&local_eb0);
            std::__cxx11::string::~string((string *)&local_eb0);
          }
        }
        cmCTestCurl::~cmCTestCurl((cmCTestCurl *)local_d00);
      }
      bVar3 = std::operator==(local_648,"Done.xml");
      if (bVar3) {
        cmCTest::GenerateDoneFile((this->super_cmCTestGenericHandler).CTest);
      }
      std::__cxx11::string::operator+=((string *)local_c70,"&MD5=");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ed8,"InternalTest",(allocator<char> *)((long)&hasher.CTX + 7));
      local_eb8 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_ed8);
      bVar3 = cmValue::IsOn(&local_eb8);
      std::__cxx11::string::~string((string *)&local_ed8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&hasher.CTX + 7));
      if (bVar3) {
        std::__cxx11::string::operator+=((string *)local_c70,"ffffffffffffffffffffffffffffffff");
      }
      else {
        cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_ef0,AlgoMD5);
        cmCryptoHash::HashFile(&local_f10,(cmCryptoHash *)local_ef0,(string *)local_bc8);
        std::__cxx11::string::operator+=((string *)local_c70,(string *)&local_f10);
        std::__cxx11::string::~string((string *)&local_f10);
        cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_ef0);
      }
      bVar3 = cmsys::SystemTools::FileExists((string *)local_bc8);
      if (bVar3) {
        uVar15 = cmsys::SystemTools::FileLength((string *)local_bc8);
        error_buffer._1016_8_ = cmsys::SystemTools::Fopen((string *)local_bc8,"rb");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1230);
        poVar13 = std::operator<<((ostream *)local_1230,"   Upload file: ");
        poVar13 = std::operator<<(poVar13,(string *)local_bc8);
        poVar13 = std::operator<<(poVar13," to ");
        poVar13 = std::operator<<(poVar13,(string *)local_c70);
        poVar13 = std::operator<<(poVar13," Size: ");
        pvVar16 = (void *)std::ostream::operator<<(poVar13,uVar15);
        std::ostream::operator<<(pvVar16,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x142,pcVar10,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string
                  ((string *)
                   &chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1230);
        uVar11 = std::__cxx11::string::c_str();
        curl_easy_setopt(data,CURLOPT_URL,uVar11);
        curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
        curl_easy_setopt(data,CURLOPT_HTTPAUTH,0xffffffffffffffef);
        curl_easy_setopt(data,CURLOPT_READDATA,error_buffer._1016_8_);
        curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar15);
        curl_easy_setopt(data,CURLOPT_ERRORBUFFER,&headers);
        curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmCTestSubmitHandlerWriteMemoryCallback);
        curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmCTestSubmitHandlerCurlDebugCallback);
        puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)puVar1);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_1280);
        curl_easy_setopt(data,CURLOPT_WRITEDATA,puVar1);
        curl_easy_setopt(data,CURLOPT_DEBUGDATA,local_1280);
        curl_easy_perform(data);
        bVar3 = std::vector<char,_std::allocator<char>_>::empty
                          ((vector<char,_std::allocator<char>_> *)
                           &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13f8);
          poVar13 = std::operator<<((ostream *)local_13f8,"CURL output: [");
          puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
          pcVar10 = std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)puVar1);
          sVar17 = std::vector<char,_std::allocator<char>_>::size
                             ((vector<char,_std::allocator<char>_> *)puVar1);
          cmCTestLogWrite::cmCTestLogWrite(&local_1408,pcVar10,sVar17);
          poVar13 = ::operator<<(poVar13,&local_1408);
          poVar13 = std::operator<<(poVar13,"]");
          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x16b,pcVar10,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1428);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13f8);
          std::vector<char,_std::allocator<char>_>::vector
                    (&local_1440,
                     (vector<char,_std::allocator<char>_> *)
                     &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10)
          ;
          ParseResponse(this,&local_1440);
          std::vector<char,_std::allocator<char>_>::~vector(&local_1440);
        }
        bVar3 = std::vector<char,_std::allocator<char>_>::empty
                          ((vector<char,_std::allocator<char>_> *)local_1280);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_15b8);
          poVar13 = std::operator<<((ostream *)local_15b8,"CURL debug output: [");
          pcVar10 = std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)local_1280);
          sVar17 = std::vector<char,_std::allocator<char>_>::size
                             ((vector<char,_std::allocator<char>_> *)local_1280);
          cmCTestLogWrite::cmCTestLogWrite(&local_15c8,pcVar10,sVar17);
          poVar13 = ::operator<<(poVar13,&local_15c8);
          poVar13 = std::operator<<(poVar13,"]");
          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x174,pcVar10,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)&response_code);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_15b8);
        }
        curl_easy_getinfo(data,CURLINFO_RESPONSE_CODE,&stack0xffffffffffffea10);
        retryDelay.field_2._M_local_buf[0xf] = lStack_15f0 == 200;
        if ((!(bool)retryDelay.field_2._M_local_buf[0xf]) || ((this->HasErrors & 1U) != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1640,"RetryDelay",
                     (allocator<char> *)(retryCount.field_2._M_local_buf + 0xf));
          local_1620 = cmCTestGenericHandler::GetOption
                                 (&this->super_cmCTestGenericHandler,&local_1640);
          psVar18 = cmValue::operator*[abi_cxx11_(&local_1620);
          std::__cxx11::string::string(local_1618,(string *)psVar18);
          std::__cxx11::string::~string((string *)&local_1640);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(retryCount.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1690,"RetryCount",(allocator<char> *)((long)&delay.__r + 7));
          local_1670 = cmCTestGenericHandler::GetOption
                                 (&this->super_cmCTestGenericHandler,&local_1690);
          psVar18 = cmValue::operator*[abi_cxx11_(&local_1670);
          std::__cxx11::string::string(local_1668,(string *)psVar18);
          std::__cxx11::string::~string((string *)&local_1690);
          std::allocator<char>::~allocator((allocator<char> *)((long)&delay.__r + 7));
          uVar12 = std::__cxx11::string::empty();
          local_16ea = 0;
          local_16eb = 0;
          local_16ec = 0;
          if ((uVar12 & 1) == 0) {
            pcVar10 = (char *)std::__cxx11::string::c_str();
            local_255c = atoi(pcVar10);
          }
          else {
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::allocator<char>::allocator();
            local_16ea = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&count,"CTestSubmitRetryDelay",&local_16e9);
            local_16eb = 1;
            cmCTest::GetCTestConfiguration(&local_16c8,pcVar2,(string *)&count);
            local_16ec = 1;
            pcVar10 = (char *)std::__cxx11::string::c_str();
            local_255c = atoi(pcVar10);
          }
          local_16a4 = local_255c;
          std::chrono::duration<double,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<double,std::ratio<1l,1l>> *)&local_16a0,&local_16a4);
          if ((local_16ec & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_16c8);
          }
          if ((local_16eb & 1) != 0) {
            std::__cxx11::string::~string((string *)&count);
          }
          if ((local_16ea & 1) != 0) {
            std::allocator<char>::~allocator(&local_16e9);
          }
          uVar12 = std::__cxx11::string::empty();
          if ((uVar12 & 1) == 0) {
            pcVar10 = (char *)std::__cxx11::string::c_str();
            local_16f0 = atoi(pcVar10);
          }
          else {
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&i,"CTestSubmitRetryCount",&local_1731);
            cmCTest::GetCTestConfiguration(&local_1710,pcVar2,(string *)&i);
            pcVar10 = (char *)std::__cxx11::string::c_str();
            iVar4 = atoi(pcVar10);
            std::__cxx11::string::~string((string *)&local_1710);
            std::__cxx11::string::~string((string *)&i);
            std::allocator<char>::~allocator(&local_1731);
            local_16f0 = iVar4;
          }
          for (local_1738 = 0; local_1738 < local_16f0; local_1738 = local_1738 + 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18b0);
            poVar13 = std::operator<<((ostream *)local_18b0,"   Submit failed, waiting ");
            rVar19 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_16a0);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,rVar19);
            std::operator<<(poVar13," seconds...\n");
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar10 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,399,pcVar10,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string((string *)&stop);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18b0);
            local_18e0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
            local_18d8 = std::chrono::operator+(&local_18e0,&local_16a0);
            while( true ) {
              local_18e8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
              bVar3 = std::chrono::operator<(&local_18e8,&local_18d8);
              if (!bVar3) break;
              cmsys::SystemTools::Delay(100);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a60);
            poVar13 = std::operator<<((ostream *)local_1a60,"   Retry submission: Attempt ");
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_1738 + 1);
            poVar13 = std::operator<<(poVar13," of ");
            pvVar16 = (void *)std::ostream::operator<<(poVar13,local_16f0);
            std::ostream::operator<<(pvVar16,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar10 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x199,pcVar10,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string(local_1a80);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a60);
            fclose((FILE *)error_buffer._1016_8_);
            error_buffer._1016_8_ = cmsys::SystemTools::Fopen((string *)local_bc8,"rb");
            curl_easy_setopt(data,CURLOPT_READDATA,error_buffer._1016_8_);
            std::vector<char,_std::allocator<char>_>::clear
                      ((vector<char,_std::allocator<char>_> *)
                       &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10);
            std::vector<char,_std::allocator<char>_>::clear
                      ((vector<char,_std::allocator<char>_> *)local_1280);
            this->HasErrors = false;
            curl_easy_perform(data);
            bVar3 = std::vector<char,_std::allocator<char>_>::empty
                              ((vector<char,_std::allocator<char>_> *)
                               &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                field_0x10);
            if (!bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1bf8);
              poVar13 = std::operator<<((ostream *)local_1bf8,"CURL output: [");
              puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10;
              pcVar10 = std::vector<char,_std::allocator<char>_>::data
                                  ((vector<char,_std::allocator<char>_> *)puVar1);
              sVar17 = std::vector<char,_std::allocator<char>_>::size
                                 ((vector<char,_std::allocator<char>_> *)puVar1);
              cmCTestLogWrite::cmCTestLogWrite(&local_1c08,pcVar10,sVar17);
              poVar13 = ::operator<<(poVar13,&local_1c08);
              poVar13 = std::operator<<(poVar13,"]");
              std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar10 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar2,0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                           ,0x1aa,pcVar10,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string(local_1c28);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1bf8);
              std::vector<char,_std::allocator<char>_>::vector
                        (&local_1c40,
                         (vector<char,_std::allocator<char>_> *)
                         &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          field_0x10);
              ParseResponse(this,&local_1c40);
              std::vector<char,_std::allocator<char>_>::~vector(&local_1c40);
            }
            curl_easy_getinfo(data,CURLINFO_RESPONSE_CODE,&stack0xffffffffffffea10);
            if ((lStack_15f0 == 200) && ((this->HasErrors & 1U) == 0)) {
              retryDelay.field_2._M_local_buf[0xf] = '\x01';
              break;
            }
          }
          std::__cxx11::string::~string(local_1668);
          std::__cxx11::string::~string(local_1618);
        }
        fclose((FILE *)error_buffer._1016_8_);
        if ((retryDelay.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1db8);
          poVar13 = std::operator<<((ostream *)local_1db8,"   Error when uploading file: ");
          poVar13 = std::operator<<(poVar13,(string *)local_bc8);
          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1ba,pcVar10,false);
          std::__cxx11::string::~string(local_1dd8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1db8);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f50);
          poVar13 = std::operator<<((ostream *)local_1f50,"   Error message was: ");
          poVar13 = std::operator<<(poVar13,(char *)&headers);
          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1bc,pcVar10,false);
          std::__cxx11::string::~string(local_1f70);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f50);
          poVar13 = std::operator<<(this->LogFile,"   Error when uploading file: ");
          poVar13 = std::operator<<(poVar13,(string *)local_bc8);
          poVar13 = (ostream *)
                    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          poVar13 = std::operator<<(poVar13,"   Error message was: ");
          poVar13 = std::operator<<(poVar13,(char *)&headers);
          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          bVar3 = std::vector<char,_std::allocator<char>_>::empty
                            ((vector<char,_std::allocator<char>_> *)
                             &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10);
          if (!bVar3) {
            poVar13 = std::operator<<(this->LogFile,"   Curl output was: ");
            puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
            pcVar10 = std::vector<char,_std::allocator<char>_>::data
                                ((vector<char,_std::allocator<char>_> *)puVar1);
            sVar17 = std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)puVar1);
            cmCTestLogWrite::cmCTestLogWrite(&local_1f80,pcVar10,sVar17);
            poVar13 = ::operator<<(poVar13,&local_1f80);
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_20f8);
            poVar13 = std::operator<<((ostream *)local_20f8,"CURL output: [");
            puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
            pcVar10 = std::vector<char,_std::allocator<char>_>::data
                                ((vector<char,_std::allocator<char>_> *)puVar1);
            sVar17 = std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)puVar1);
            cmCTestLogWrite::cmCTestLogWrite(&local_2108,pcVar10,sVar17);
            poVar13 = ::operator<<(poVar13,&local_2108);
            poVar13 = std::operator<<(poVar13,"]");
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar10 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x1c9,pcVar10,false);
            std::__cxx11::string::~string(local_2128);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_20f8);
          }
          curl_easy_cleanup(data);
          curl_slist_free_all((curl_slist *)__range1);
          curl_global_cleanup();
          this_local._7_1_ = 0;
          bVar3 = true;
        }
        else {
          curl_easy_cleanup(data);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_22a0);
          std::operator+(&local_22c0,"   Uploaded: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_bc8);
          poVar13 = std::operator<<((ostream *)local_22a0,(string *)&local_22c0);
          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_22c0);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1d4,pcVar10,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_22e0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_22a0);
          bVar3 = false;
        }
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_1280);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)
                   &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1088);
        poVar13 = std::operator<<((ostream *)local_1088,"   Cannot find file: ");
        poVar13 = std::operator<<(poVar13,(string *)local_bc8);
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x135,pcVar10,false);
        std::__cxx11::string::~string(local_10a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1088);
        curl_easy_cleanup(data);
        curl_slist_free_all((curl_slist *)__range1);
        curl_global_cleanup();
        this_local._7_1_ = 0;
        bVar3 = true;
      }
      std::__cxx11::string::~string((string *)local_c70);
      std::__cxx11::string::~string((string *)(upload_as.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_c10);
      std::__cxx11::string::~string((string *)local_bc8);
      if (bVar3) goto LAB_0025d3ae;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  curl_slist_free_all((curl_slist *)__range1);
  curl_global_cleanup();
  this_local._7_1_ = 1;
LAB_0025d3ae:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestSubmitHandler::SubmitUsingHTTP(
  const std::string& localprefix, const std::vector<std::string>& files,
  const std::string& remoteprefix, const std::string& url)
{
  CURL* curl;
  FILE* ftpfile;
  char error_buffer[1024];
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");

  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }

  /* In windows, this will init the winsock stuff */
  ::curl_global_init(CURL_GLOBAL_ALL);
  cmCTestCurlOpts curlOpts(this->CTest);
  for (std::string const& file : files) {
    /* get a curl handle */
    curl = curl_easy_init();
    if (curl) {
      cmCurlSetCAInfo(curl);
      if (curlOpts.TLSVersionOpt) {
        cm::optional<std::string> tlsVersionStr =
          cmCurlPrintTLSVersion(*curlOpts.TLSVersionOpt);
        cmCTestOptionalLog(
          this->CTest, HANDLER_VERBOSE_OUTPUT,
          "  Set CURLOPT_SSLVERSION to "
            << (tlsVersionStr ? *tlsVersionStr : "unknown value") << "\n",
          this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSLVERSION, *curlOpts.TLSVersionOpt);
      }
      if (curlOpts.TLSVerifyOpt) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYPEER to "
                             << (*curlOpts.TLSVerifyOpt ? "on" : "off")
                             << "\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER,
                         *curlOpts.TLSVerifyOpt ? 1 : 0);
      }
      if (curlOpts.VerifyHostOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYHOST to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
      }

      // Using proxy
      if (this->HTTPProxyType > 0) {
        curl_easy_setopt(curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
        switch (this->HTTPProxyType) {
          case 2:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
            break;
          case 3:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
            break;
          default:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
            if (!this->HTTPProxyAuth.empty()) {
              curl_easy_setopt(curl, CURLOPT_PROXYUSERPWD,
                               this->HTTPProxyAuth.c_str());
            }
        }
      }
      if (this->CTest->ShouldUseHTTP10()) {
        curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
      }
      /* enable uploading */
      curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);

      // if there is little to no activity for too long stop submitting
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
      auto submitInactivityTimeout = this->GetSubmitInactivityTimeout();
      if (submitInactivityTimeout != 0) {
        ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME,
                           submitInactivityTimeout);
      }

      ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);

      ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

      std::string local_file = file;
      bool initialize_cdash_buildid = false;
      if (!cmSystemTools::FileExists(local_file)) {
        local_file = cmStrCat(localprefix, "/", file);
        // If this file exists within the local Testing directory we assume
        // that it will be associated with the current build in CDash.
        initialize_cdash_buildid = true;
      }
      std::string remote_file =
        remoteprefix + cmSystemTools::GetFilenameName(file);

      *this->LogFile << "\tUpload file: " << local_file << " to "
                     << remote_file << std::endl;

      std::string ofile = cmSystemTools::EncodeURL(remote_file);
      std::string upload_as =
        cmStrCat(url, ((url.find('?') == std::string::npos) ? '?' : '&'),
                 "FileName=", ofile);

      if (initialize_cdash_buildid) {
        // Provide extra arguments to CDash so that it can initialize and
        // return a buildid.
        cmCTestCurl ctest_curl(this->CTest);
        upload_as += "&build=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("BuildName"));
        upload_as += "&site=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("Site"));
        upload_as += "&stamp=";
        upload_as += ctest_curl.Escape(this->CTest->GetCurrentTag());
        upload_as += "-";
        upload_as += ctest_curl.Escape(this->CTest->GetTestModelString());
        cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
        cmake* cm = ch->GetCMake();
        if (cm) {
          cmValue subproject = cm->GetState()->GetGlobalProperty("SubProject");
          if (subproject) {
            upload_as += "&subproject=";
            upload_as += ctest_curl.Escape(*subproject);
          }
        }
      }

      // Generate Done.xml right before it is submitted.
      // The reason for this is two-fold:
      // 1) It must be generated after some other part has been submitted
      //    so we have a buildId to refer to in its contents.
      // 2) By generating Done.xml here its timestamp will be as late as
      //    possible. This gives us a more accurate record of how long the
      //    entire build took to complete.
      if (file == "Done.xml") {
        this->CTest->GenerateDoneFile();
      }

      upload_as += "&MD5=";

      if (this->GetOption("InternalTest").IsOn()) {
        upload_as += "ffffffffffffffffffffffffffffffff";
      } else {
        cmCryptoHash hasher(cmCryptoHash::AlgoMD5);
        upload_as += hasher.HashFile(local_file);
      }

      if (!cmSystemTools::FileExists(local_file)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Cannot find file: " << local_file << std::endl);
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      unsigned long filelen = cmSystemTools::FileLength(local_file);

      ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "   Upload file: " << local_file << " to "
                                            << upload_as << " Size: "
                                            << filelen << std::endl,
                         this->Quiet);

      // specify target
      ::curl_easy_setopt(curl, CURLOPT_URL, upload_as.c_str());

      // follow redirects
      ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1);

      // CURLAUTH_BASIC is default, and here we allow additional methods,
      // including more secure ones
      ::curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_ANY);

      // now specify which file to upload
      ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

      // and give the size of the upload (optional)
      ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(filelen));

      // and give curl the buffer for errors
      ::curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, &error_buffer);

      // specify handler for output
      ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                         cmCTestSubmitHandlerWriteMemoryCallback);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                         cmCTestSubmitHandlerCurlDebugCallback);

      /* we pass our 'chunk' struct to the callback function */
      cmCTestSubmitHandlerVectorOfChar chunk;
      cmCTestSubmitHandlerVectorOfChar chunkDebug;
      ::curl_easy_setopt(curl, CURLOPT_FILE, &chunk);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);

      // Now run off and do what you've been told!
      ::curl_easy_perform(curl);

      if (!chunk.empty()) {
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "CURL output: ["
                             << cmCTestLogWrite(chunk.data(), chunk.size())
                             << "]" << std::endl,
                           this->Quiet);
        this->ParseResponse(chunk);
      }
      if (!chunkDebug.empty()) {
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "CURL debug output: ["
            << cmCTestLogWrite(chunkDebug.data(), chunkDebug.size()) << "]"
            << std::endl,
          this->Quiet);
      }

      // If curl failed for any reason, or checksum fails, wait and retry
      //
      long response_code;
      curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response_code);
      bool successful_submission = response_code == 200;

      if (!successful_submission || this->HasErrors) {
        std::string retryDelay = *this->GetOption("RetryDelay");
        std::string retryCount = *this->GetOption("RetryCount");

        auto delay = cmDuration(
          retryDelay.empty()
            ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryDelay")
                     .c_str())
            : atoi(retryDelay.c_str()));
        int count = retryCount.empty()
          ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryCount")
                   .c_str())
          : atoi(retryCount.c_str());

        for (int i = 0; i < count; i++) {
          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Submit failed, waiting " << delay.count()
                                                          << " seconds...\n",
                             this->Quiet);

          auto stop = std::chrono::steady_clock::now() + delay;
          while (std::chrono::steady_clock::now() < stop) {
            cmSystemTools::Delay(100);
          }

          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Retry submission: Attempt "
                               << (i + 1) << " of " << count << std::endl,
                             this->Quiet);

          ::fclose(ftpfile);
          ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
          ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

          chunk.clear();
          chunkDebug.clear();
          this->HasErrors = false;

          ::curl_easy_perform(curl);

          if (!chunk.empty()) {
            cmCTestOptionalLog(this->CTest, DEBUG,
                               "CURL output: ["
                                 << cmCTestLogWrite(chunk.data(), chunk.size())
                                 << "]" << std::endl,
                               this->Quiet);
            this->ParseResponse(chunk);
          }

          curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response_code);
          if (response_code == 200 && !this->HasErrors) {
            successful_submission = true;
            break;
          }
        }
      }

      fclose(ftpfile);
      if (!successful_submission) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error when uploading file: " << local_file
                                                    << std::endl);
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error message was: " << error_buffer << std::endl);
        *this->LogFile << "   Error when uploading file: " << local_file
                       << std::endl
                       << "   Error message was: " << error_buffer
                       << std::endl;
        // avoid deref of begin for zero size array
        if (!chunk.empty()) {
          *this->LogFile << "   Curl output was: "
                         << cmCTestLogWrite(chunk.data(), chunk.size())
                         << std::endl;
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "CURL output: ["
                       << cmCTestLogWrite(chunk.data(), chunk.size()) << "]"
                       << std::endl);
        }
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      // always cleanup
      ::curl_easy_cleanup(curl);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Uploaded: " + local_file << std::endl,
                         this->Quiet);
    }
  }
  ::curl_slist_free_all(headers);
  ::curl_global_cleanup();
  return true;
}